

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float16 float16_muladd_ppc(float16 a,float16 b,float16 c,int flags,float_status *status)

{
  long lVar1;
  byte bVar2;
  uint64_t uVar3;
  float16 fVar4;
  uint64_t uVar5;
  byte bVar6;
  uint uVar7;
  undefined4 in_register_0000000c;
  uint uVar8;
  int count;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint64_t uVar19;
  FloatParts FVar20;
  FloatParts FVar21;
  FloatParts c_00;
  FloatParts b_00;
  ulong local_78;
  ulong local_70;
  uint64_t local_68;
  ulong local_60;
  ulong local_58;
  uint64_t local_50;
  uint64_t c_lo;
  uint64_t c_hi;
  uint64_t local_38;
  
  local_60 = CONCAT44(in_register_0000000c,flags);
  FVar20 = float16a_unpack_canonical(a,status,&float16_params);
  uVar13 = FVar20._8_8_;
  local_50 = FVar20.frac;
  FVar21 = float16a_unpack_canonical(b,status,&float16_params);
  uVar11 = FVar21._8_8_;
  uVar19 = FVar21.frac;
  c_00 = float16a_unpack_canonical(c,status,&float16_params);
  uVar3 = local_50;
  uVar10 = c_00._8_8_;
  uVar5 = c_00.frac;
  uVar8 = 1 << (FVar21.cls & 0x1f) | 1 << (FVar20._12_4_ & 0x1f);
  if (((uVar13 | uVar11 | uVar10) & 0xfc00000000) != 0) {
    uVar11 = uVar11 & 0xffffffffffff;
    FVar21.exp = (int)uVar13;
    FVar21.cls = (char)(uVar13 >> 0x20);
    FVar21.sign = (_Bool)(char)(uVar13 >> 0x28);
    FVar21._14_2_ = (short)(uVar13 >> 0x30);
    FVar21.frac = local_50;
    b_00.exp = (int)uVar11;
    b_00.cls = (char)(uVar11 >> 0x20);
    b_00.sign = (_Bool)(char)(uVar11 >> 0x28);
    b_00._14_2_ = (short)(uVar11 >> 0x30);
    b_00.frac = uVar19;
    FVar20 = pick_nan_muladd(FVar21,b_00,c_00,uVar8 == 10,status);
    goto LAB_00922d53;
  }
  local_38 = uVar19;
  if (uVar8 != 10) {
    uVar8 = FVar20._12_4_ & 0xff;
    uVar15 = (uint)local_60 & 4;
    uVar12 = 0x10000000000;
    uVar17 = uVar10 & 0xffff0103ffffffff ^ 0x10000000000;
    if ((local_60 & 1) == 0) {
      uVar17 = uVar10;
    }
    uVar10 = (uVar11 ^ uVar13) & 0x10000000000;
    uVar11 = (ulong)(uVar10 == 0);
    if ((local_60 & 2) == 0) {
      uVar11 = uVar10 >> 0x28;
    }
    uVar9 = (uint)(uVar17 >> 0x20);
    uVar14 = (uint)uVar11;
    if ((uVar8 != 3) && (uVar7 = FVar21._12_4_ & 0xff, uVar7 != 3)) {
      uVar18 = uVar9 & 3;
      local_70 = uVar13;
      local_68 = uVar5;
      if (uVar18 == 3) {
        uVar8 = uVar9 >> 8 & 1;
LAB_00922d10:
        if (uVar8 == uVar15 >> 2) {
          uVar12 = 0;
        }
        goto LAB_00922d4a;
      }
      uVar16 = (uint)uVar17;
      if ((uVar8 == 1) || (uVar7 == 1)) {
        if (uVar18 == 1) {
          if ((uVar9 >> 8 & 1) != uVar14) {
            uVar11 = (ulong)(status->float_rounding_mode == '\x01');
          }
          uVar17 = uVar17 & 0xffff0003ffffffff | uVar11 << 0x28;
        }
        else if ((local_60 & 8) != 0) {
          uVar17 = uVar17 & 0xffffff0300000000 | (ulong)(uVar16 - 1);
        }
        if (((uint)(uVar17 >> 0x28) & 1) == uVar15 >> 2) {
          uVar12 = 0;
        }
        uVar12 = uVar12 | uVar17 & 0xffff00ffffffffff;
        FVar20.exp = (int)uVar12;
        FVar20.cls = (char)(uVar12 >> 0x20);
        FVar20.sign = (_Bool)(char)(uVar12 >> 0x28);
        FVar20._14_2_ = (short)(uVar12 >> 0x30);
        FVar20.frac = uVar5;
        goto LAB_00922d53;
      }
      if ((uVar8 != 2) || (uVar7 != 2)) {
        __assert_fail("a.cls == float_class_normal && b.cls == float_class_normal",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                      ,0x58e,
                      "FloatParts muladd_floats(FloatParts, FloatParts, FloatParts, int, float_status *)"
                     );
      }
      uVar8 = FVar21.exp + FVar20.exp;
      mul64To128(local_50,uVar19,&local_58,&local_78);
      uVar19 = local_68;
      if ((local_58 >> 0x3d & 1) != 0) {
        local_78 = (ulong)((uint)local_78 & 1) | local_58 << 0x3f | local_78 >> 1;
        local_58 = local_58 >> 1;
        uVar8 = uVar8 + 1;
      }
      uVar13 = local_58;
      if (uVar18 == 1) {
        uVar19 = (ulong)((local_78 & 0x3fffffffffffffff) != 0) | local_58 << 2 | local_78 >> 0x3e;
      }
      else {
        count = uVar8 - uVar16;
        if ((uVar9 >> 8 & 1) == uVar14) {
          if (count < 1) {
            shift128RightJamming(local_58,local_78,0x3e - count,&local_58,&local_78);
            uVar19 = uVar19 + local_78;
          }
          else {
            c_hi = local_68 >> 2;
            c_lo = 0;
            shift128RightJamming(c_hi,0,count,&c_hi,&c_lo);
            uVar19 = (ulong)((c_lo + local_78 & 0x3fffffffffffffff) != 0) |
                     (uVar13 + c_hi + (ulong)CARRY8(c_lo,local_78)) * 4 | c_lo + local_78 >> 0x3e;
            uVar17 = (ulong)uVar8;
          }
          uVar8 = (uint)uVar17;
          if ((long)uVar19 < 0) {
            uVar19 = (ulong)((uint)uVar19 & 1) | uVar19 >> 1;
            uVar8 = uVar8 + 1;
          }
        }
        else {
          uVar10 = local_68 >> 2;
          c_lo = 0;
          c_hi = uVar10;
          if (count < 1) {
            shift128RightJamming(local_58,local_78,-count,&local_58,&local_78);
            uVar12 = local_58 - uVar10;
            uVar13 = local_78;
            if (local_58 < uVar10 || uVar8 != uVar16) {
              uVar12 = (uVar10 - local_58) - (ulong)(local_78 != 0);
              uVar14 = (uint)(byte)((byte)uVar11 ^ 1);
              uVar13 = -local_78;
              uVar8 = uVar16;
            }
          }
          else {
            shift128RightJamming(uVar10,0,count,&c_hi,&c_lo);
            uVar12 = (uVar13 - c_hi) - (ulong)(local_78 < c_lo);
            uVar13 = local_78 - c_lo;
          }
          if (uVar12 == 0 && uVar13 == 0) {
            uVar13 = 0x10000000000;
            if (uVar15 >> 2 == (uint)(status->float_rounding_mode == '\x01')) {
              uVar13 = 0;
            }
            uVar12 = (uVar13 | local_70 & 0xffff0000ffffffff) + 0x100000000;
            goto LAB_00922d50;
          }
          if (uVar12 == 0) {
            if (uVar13 == 0) {
              uVar11 = 0x40;
            }
            else {
              uVar11 = 0x3f;
              if (uVar13 != 0) {
                for (; uVar13 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
              uVar11 = uVar11 ^ 0x3f;
            }
            if (uVar11 == 0) {
              uVar9 = 0x40;
              goto LAB_00923073;
            }
            uVar9 = (int)uVar11 + 0x40;
            uVar19 = uVar13 << ((char)uVar11 - 1U & 0x3f);
          }
          else {
            lVar1 = 0x3f;
            if (uVar12 != 0) {
              for (; uVar12 >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            uVar9 = (uint)lVar1 ^ 0x3f;
LAB_00923073:
            bVar6 = (char)uVar9 - 1;
            bVar2 = bVar6 & 0x3f;
            uVar19 = (ulong)(uVar13 << (bVar6 & 0x3f) != 0) |
                     uVar12 << bVar2 | uVar13 >> 0x40 - bVar2;
          }
          uVar8 = (uVar8 - uVar9) + 3;
        }
      }
      uVar13 = 0x10000000000;
      if (uVar15 >> 2 == uVar14) {
        uVar13 = 0;
      }
      uVar13 = uVar13 | local_70 & 0xffff000000000000 |
               (ulong)((((int)local_60 << 0x1c) >> 0x1f) + uVar8) | 0x200000000;
      FVar20.exp = (int)uVar13;
      FVar20.cls = (char)(uVar13 >> 0x20);
      FVar20.sign = (_Bool)(char)(uVar13 >> 0x28);
      FVar20._14_2_ = (short)(uVar13 >> 0x30);
      FVar20.frac = uVar19;
      goto LAB_00922d53;
    }
    if ((~uVar17 & 0x300000000) != 0) {
      if (uVar15 >> 2 == uVar14) {
        uVar12 = 0;
      }
LAB_00922d4a:
      uVar12 = uVar12 | uVar13 & 0xffff0000ffffffff | 0x300000000;
LAB_00922d50:
      FVar20.exp = (int)uVar12;
      FVar20.cls = (char)(uVar12 >> 0x20);
      FVar20.sign = (_Bool)(char)(uVar12 >> 0x28);
      FVar20._14_2_ = (short)(uVar12 >> 0x30);
      FVar20.frac = uVar3;
      goto LAB_00922d53;
    }
    uVar8 = uVar9 >> 8 & 1;
    if (uVar8 == uVar14) goto LAB_00922d10;
  }
  FVar20.exp = 0x7fffffff;
  FVar20.cls = float_class_qnan;
  FVar20.sign = false;
  FVar20._14_2_ = 0;
  FVar20.frac = 0x2000000000000000;
  status->float_exception_flags = status->float_exception_flags | 1;
LAB_00922d53:
  fVar4 = float16a_round_pack_canonical(FVar20,status,&float16_params);
  return fVar4;
}

Assistant:

float16 QEMU_FLATTEN float16_muladd(float16 a, float16 b, float16 c,
                                                int flags, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pc = float16_unpack_canonical(c, status);
    FloatParts pr = muladd_floats(pa, pb, pc, flags, status);

    return float16_round_pack_canonical(pr, status);
}